

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O3

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyTableStart(VerifierTemplate<false> *this,uint8_t *table)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar7 = (long)table - (long)this->buf_;
  bVar1 = (this->opts_).check_alignment;
  if ((((uVar7 & 3) != 0 & bVar1) == 0) && (uVar5 = this->size_, uVar7 <= uVar5 - 4 && 4 < uVar5)) {
    iVar3 = *(int *)table;
    uVar4 = (this->opts_).max_tables;
    uVar8 = this->depth_ + 1;
    this->depth_ = uVar8;
    uVar9 = this->num_tables_ + 1;
    this->num_tables_ = uVar9;
    bVar6 = false;
    if ((uVar8 <= (this->opts_).max_depth) && (bVar6 = false, uVar9 <= uVar4)) {
      uVar7 = uVar7 - (long)iVar3;
      if (uVar5 - 2 < uVar7 || ((byte)uVar7 & bVar1 & 1) != 0) {
        bVar6 = false;
      }
      else {
        uVar2 = *(ushort *)(this->buf_ + uVar7);
        bVar6 = false;
        if (((uVar2 & 1) == 0) && ((uVar2 & 1) == 0 || ((bVar1 ^ 1U) & 1) != 0)) {
          bVar6 = uVar7 <= uVar5 - uVar2 && uVar2 < uVar5;
        }
      }
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool VerifyTableStart(const uint8_t *const table) {
    // Check the vtable offset.
    const auto tableo = static_cast<size_t>(table - buf_);
    if (!Verify<soffset_t>(tableo)) return false;
    // This offset may be signed, but doing the subtraction unsigned always
    // gives the result we want.
    const auto vtableo =
        tableo - static_cast<size_t>(ReadScalar<soffset_t>(table));
    // Check the vtable size field, then check vtable fits in its entirety.
    if (!(VerifyComplexity() && Verify<voffset_t>(vtableo) &&
          VerifyAlignment(ReadScalar<voffset_t>(buf_ + vtableo),
                          sizeof(voffset_t))))
      return false;
    const auto vsize = ReadScalar<voffset_t>(buf_ + vtableo);
    return Check((vsize & 1) == 0) && Verify(vtableo, vsize);
  }